

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

int __thiscall Fl_Window_Type::read_fdesign(Fl_Window_Type *this,char *propname,char *value)

{
  int iVar1;
  int W;
  Fl_Widget *this_00;
  int x;
  
  ((this->super_Fl_Widget_Type).o)->box_ = '\0';
  iVar1 = strcmp(propname,"Width");
  if (iVar1 == 0) {
    iVar1 = __isoc99_sscanf(value,"%d",&x);
    if (iVar1 != 1) {
      return 1;
    }
    this_00 = (this->super_Fl_Widget_Type).o;
    iVar1 = this_00->h_;
    W = x;
  }
  else {
    iVar1 = strcmp(propname,"Height");
    if (iVar1 != 0) {
      iVar1 = strcmp(propname,"NumberofWidgets");
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = strcmp(propname,"border");
      if (iVar1 != 0) {
        iVar1 = strcmp(propname,"title");
        if (iVar1 == 0) {
          Fl_Type::label((Fl_Type *)this,value);
          return 1;
        }
        iVar1 = Fl_Widget_Type::read_fdesign(&this->super_Fl_Widget_Type,propname,value);
        return iVar1;
      }
      iVar1 = __isoc99_sscanf(value,"%d",&x);
      if (iVar1 != 1) {
        return 1;
      }
      Fl_Window::border((Fl_Window *)(this->super_Fl_Widget_Type).o,x);
      return 1;
    }
    iVar1 = __isoc99_sscanf(value,"%d",&x);
    if (iVar1 != 1) {
      return 1;
    }
    this_00 = (this->super_Fl_Widget_Type).o;
    W = this_00->w_;
    iVar1 = x;
  }
  Fl_Widget::size(this_00,W,iVar1);
  return 1;
}

Assistant:

int Fl_Window_Type::read_fdesign(const char* propname, const char* value) {
  int x;
  o->box(FL_NO_BOX); // because fdesign always puts an Fl_Box next
  if (!strcmp(propname,"Width")) {
    if (sscanf(value,"%d",&x) == 1) o->size(x,o->h());
  } else if (!strcmp(propname,"Height")) {
    if (sscanf(value,"%d",&x) == 1) o->size(o->w(),x);
  } else if (!strcmp(propname,"NumberofWidgets")) {
    return 1; // we can figure out count from file
  } else if (!strcmp(propname,"border")) {
    if (sscanf(value,"%d",&x) == 1) ((Fl_Window*)o)->border(x);
  } else if (!strcmp(propname,"title")) {
    label(value);
  } else {
    return Fl_Widget_Type::read_fdesign(propname,value);
  }
  return 1;
}